

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O2

void __thiscall
slang::ast::builtins::AssocArrayExistsMethod::AssocArrayExistsMethod(AssocArrayExistsMethod *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,Exists,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_006b0600;
  return;
}

Assistant:

AssocArrayExistsMethod() :
        SystemSubroutine(KnownSystemName::Exists, SubroutineKind::Function) {}